

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall ConditionStatement::Action(ConditionStatement *this)

{
  SymbolName SVar1;
  int iVar2;
  compile_errcode cVar3;
  Statement *pSVar4;
  undefined4 uVar5;
  
  pSVar4 = (Statement *)operator_new(0x1e8);
  Statement::Statement(pSVar4);
  this->m_statement_ptr = pSVar4;
  uVar5 = 0;
LAB_00139700:
  SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
  switch(uVar5) {
  case 0:
    uVar5 = 1;
    if (SVar1 != IF_SYM) goto LAB_00139784;
    break;
  case 1:
    uVar5 = 2;
    if (SVar1 != L_CIRCLE_BRACKET_SYM) goto LAB_00139784;
    break;
  case 2:
    cVar3 = Condition::Action(&this->m_condition);
    if (cVar3 != 0) {
LAB_00139784:
      pSVar4 = this->m_statement_ptr;
      cVar3 = -1;
      goto LAB_0013978b;
    }
    Condition::LogOutput(&this->m_condition);
    uVar5 = 3;
    goto LAB_00139700;
  case 3:
    uVar5 = 4;
    if (SVar1 != R_CIRCLE_BRACKET_SYM) goto LAB_00139784;
    break;
  case 4:
    iVar2 = (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[2])();
    if (iVar2 != 0) goto LAB_00139784;
    (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[1])();
    uVar5 = 5;
    goto LAB_00139700;
  case 5:
    goto switchD_0013971c_caseD_5;
  }
  SymbolQueue::NextSymbol(handle_correct_queue);
  goto LAB_00139700;
switchD_0013971c_caseD_5:
  pSVar4 = this->m_statement_ptr;
  cVar3 = 0;
LAB_0013978b:
  if (pSVar4 != (Statement *)0x0) {
    Statement::~Statement(pSVar4);
  }
  operator_delete(pSVar4);
  return cVar3;
}

Assistant:

compile_errcode ConditionStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    m_statement_ptr = new Statement;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == IF_SYM) {
                    state = 1;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 2: {
                if ((ret = m_condition.Action()) == COMPILE_OK) {
                    m_condition.LogOutput();
                    state = 3;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 4: {
                if ((ret = m_statement_ptr->Action()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    state = 5;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 5: goto CORRECT_IF;
        }
        if (state != 3 && state != 5)
            handle_correct_queue->NextSymbol();
    }
    CORRECT_IF:
        delete(m_statement_ptr);
        return COMPILE_OK;
    ERROR_IF:
        delete(m_statement_ptr);
        return NOT_MATCH;
}